

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

void __thiscall btConvexHullInternal::removeEdgePair(btConvexHullInternal *this,Edge *edge)

{
  Edge *pEVar1;
  Edge *pEVar2;
  Edge *pEVar3;
  
  pEVar3 = edge->next;
  pEVar1 = edge->reverse;
  if (pEVar3 == edge) {
    pEVar3 = (Edge *)0x0;
  }
  else {
    pEVar2 = edge->prev;
    pEVar3->prev = pEVar2;
    pEVar2->next = pEVar3;
  }
  pEVar1->target->edges = pEVar3;
  pEVar3 = pEVar1->next;
  if (pEVar3 == pEVar1) {
    pEVar3 = (Edge *)0x0;
  }
  else {
    pEVar2 = pEVar1->prev;
    pEVar3->prev = pEVar2;
    pEVar2->next = pEVar3;
  }
  edge->target->edges = pEVar3;
  edge->face = (Face *)0x0;
  edge->reverse = (Edge *)0x0;
  edge->target = (Vertex *)0x0;
  edge->next = (Edge *)0x0;
  edge->prev = (Edge *)0x0;
  edge->next = (this->edgePool).freeObjects;
  (this->edgePool).freeObjects = edge;
  pEVar1->face = (Face *)0x0;
  pEVar1->reverse = (Edge *)0x0;
  pEVar1->target = (Vertex *)0x0;
  pEVar1->next = (Edge *)0x0;
  pEVar1->prev = (Edge *)0x0;
  pEVar1->next = (this->edgePool).freeObjects;
  (this->edgePool).freeObjects = pEVar1;
  this->usedEdgePairs = this->usedEdgePairs + -1;
  return;
}

Assistant:

void removeEdgePair(Edge* edge)
		{
			Edge* n = edge->next;
			Edge* r = edge->reverse;

			btAssert(edge->target && r->target);

			if (n != edge)
			{
				n->prev = edge->prev;
				edge->prev->next = n;
				r->target->edges = n;
			}
			else
			{
				r->target->edges = NULL;
			}
			
			n = r->next;
			
			if (n != r)
			{
				n->prev = r->prev;
				r->prev->next = n;
				edge->target->edges = n;
			}
			else
			{
				edge->target->edges = NULL;
			}

			edgePool.freeObject(edge);
			edgePool.freeObject(r);
			usedEdgePairs--;
		}